

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void __thiscall
server_context::send_partial_response
          (server_context *this,server_slot *slot,completion_token_output *tkn)

{
  double dVar1;
  double dVar2;
  int iVar3;
  uint uVar4;
  long *__s;
  size_t in_RCX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  int32_t iVar5;
  int in_R8D;
  double dVar6;
  llama_token local_34;
  long *local_30;
  
  __s = (long *)operator_new(0x130);
  memset(__s,0,0x130);
  __s[1] = -1;
  *__s = (long)&PTR_is_error_002dfdc8;
  *(undefined4 *)(__s + 2) = 0;
  __s[3] = (long)(__s + 5);
  __s[4] = 0;
  *(undefined1 *)(__s + 5) = 0;
  __s[7] = 0;
  __s[8] = 0;
  __s[9] = 0;
  __s[0xd] = (long)(__s + 0xf);
  __s[0xe] = 0;
  *(undefined1 *)(__s + 0xf) = 0;
  __s[0x11] = 0;
  __s[0x12] = 0;
  __s[0x13] = 0;
  *(undefined4 *)(__s + 0x14) = 0xffffffff;
  *(undefined4 *)(__s + 0x18) = 0xffffffff;
  *(undefined4 *)((long)__s + 0xec) = 0;
  *(undefined1 *)(__s + 0x1d) = 0;
  __s[0x1c] = 0;
  __s[0x1e] = (long)(__s + 0x20);
  __s[0x1f] = 0;
  *(undefined1 *)(__s + 0x20) = 0;
  __s[0x22] = (long)(__s + 0x24);
  __s[0x23] = 0;
  *(undefined1 *)(__s + 0x24) = 0;
  *(int *)(__s + 1) = slot->id_task;
  *(int *)(__s + 2) = (int)slot->index;
  std::__cxx11::string::_M_assign((string *)(__s + 3));
  local_34 = tkn->tok;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)(__s + 7),&local_34);
  *(int32_t *)(__s + 10) = slot->n_decoded;
  *(int32_t *)((long)__s + 0x54) = slot->n_prompt_tokens;
  *(bool *)(__s + 0xb) = (slot->params).post_sampling_probs;
  *(bool *)(__s + 0x1d) = (slot->params).verbose;
  *(oaicompat_type *)((long)__s + 0xec) = (slot->params).oaicompat;
  std::__cxx11::string::_M_assign((string *)(__s + 0x1e));
  std::__cxx11::string::_M_assign((string *)(__s + 0x22));
  __buf = extraout_RDX;
  if (0 < (slot->params).sampling.n_probs) {
    __s[0xc] = *(long *)tkn;
    std::__cxx11::string::_M_assign((string *)(__s + 0xd));
    httplib::detail::std::
    vector<completion_token_output::prob_info,_std::allocator<completion_token_output::prob_info>_>
    ::operator=((vector<completion_token_output::prob_info,_std::allocator<completion_token_output::prob_info>_>
                 *)(__s + 0x11),&tkn->probs);
    __buf = extraout_RDX_00;
  }
  if ((slot->stop != STOP_TYPE_NONE) || ((slot->params).timings_per_token == true)) {
    iVar3 = slot->n_decoded;
    uVar4 = slot->n_prompt_tokens_processed;
    in_RCX = (size_t)uVar4;
    dVar1 = slot->t_prompt_processing;
    dVar2 = slot->t_token_generation;
    dVar6 = (double)iVar3;
    __buf = (void *)0x0;
    iVar5 = 0;
    if (0 < slot->n_draft_total) {
      iVar5 = slot->n_draft_accepted;
      __buf = (void *)(ulong)(uint)slot->n_draft_total;
    }
    *(uint *)(__s + 0x14) = uVar4;
    __s[0x15] = (long)dVar1;
    __s[0x16] = (long)(dVar1 / (double)(int)uVar4);
    __s[0x17] = (long)((1000.0 / dVar1) * (double)(int)uVar4);
    *(int *)(__s + 0x18) = iVar3;
    __s[0x19] = (long)dVar2;
    __s[0x1a] = (long)(dVar2 / dVar6);
    __s[0x1b] = (long)((1000.0 / dVar2) * dVar6);
    *(int *)(__s + 0x1c) = (int)__buf;
    *(int32_t *)((long)__s + 0xe4) = iVar5;
  }
  local_30 = __s;
  server_response::send(&this->queue_results,(int)&local_30,__buf,in_RCX,in_R8D);
  if (local_30 != (long *)0x0) {
    (**(code **)(*local_30 + 0x28))();
  }
  return;
}

Assistant:

void send_partial_response(server_slot & slot, const completion_token_output & tkn) {
        auto res = std::make_unique<server_task_result_cmpl_partial>();

        res->id      = slot.id_task;
        res->index   = slot.index;
        res->content = tkn.text_to_send;
        res->tokens  = { tkn.tok };

        res->n_decoded           = slot.n_decoded;
        res->n_prompt_tokens     = slot.n_prompt_tokens;
        res->post_sampling_probs = slot.params.post_sampling_probs;

        res->verbose           = slot.params.verbose;
        res->oaicompat         = slot.params.oaicompat;
        res->oaicompat_model   = slot.params.oaicompat_model;
        res->oaicompat_cmpl_id = slot.params.oaicompat_cmpl_id;

        // populate res.probs_output
        if (slot.params.sampling.n_probs > 0) {
            res->prob_output = tkn; // copy the token probs
        }

        // populate timings if this is final response or timings_per_token is enabled
        if (slot.stop != STOP_TYPE_NONE || slot.params.timings_per_token) {
            res->timings = slot.get_timings();
        }

        queue_results.send(std::move(res));
    }